

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

Instr * __thiscall LowererMD::LowerAsmJsCallI(LowererMD *this,Instr *callInstr)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  Instr *pIVar2;
  Instr *callInstr_local;
  LowererMD *this_local;
  
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eb5b30,AsmjsCallDebugBreakPhase,sourceContextId,functionId);
  if (bVar1) {
    GenerateDebugBreak(callInstr->m_next);
  }
  pIVar2 = LowererMDArch::LowerAsmJsCallI(&this->lowererMDArch,callInstr);
  return pIVar2;
}

Assistant:

IR::Instr *
LowererMD::LowerAsmJsCallI(IR::Instr * callInstr)
{
#if DBG
    if (PHASE_ON(Js::AsmjsCallDebugBreakPhase, this->m_func))
    {
        this->GenerateDebugBreak(callInstr->m_next);
    }
#endif
    return this->lowererMDArch.LowerAsmJsCallI(callInstr);
}